

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool QApplicationPrivate::tryModalHelper(QWidget *widget,QWidget **rettop)

{
  bool bVar1;
  QWidget *widget_00;
  QWidget *pQVar2;
  undefined8 *in_RSI;
  QWidget *in_RDI;
  QWidget *top;
  undefined1 local_1;
  
  widget_00 = QApplication::activeModalWidget();
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = widget_00;
  }
  pQVar2 = QApplication::activePopupWidget();
  if (pQVar2 == (QWidget *)0x0) {
    QWidget::window(in_RDI);
    bVar1 = isBlockedByModal(widget_00);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QApplicationPrivate::tryModalHelper(QWidget *widget, QWidget **rettop)
{
    QWidget *top = QApplication::activeModalWidget();
    if (rettop)
        *rettop = top;

    // the active popup widget always gets the input event
    if (QApplication::activePopupWidget())
        return true;

    return !isBlockedByModal(widget->window());
}